

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall deqp::sl::ShaderParser::parseError(ShaderParser *this,string *errorStr)

{
  InternalError *this_00;
  char *pcVar1;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string atStr;
  string *errorStr_local;
  ShaderParser *this_local;
  
  pcVar1 = this->m_curPtr;
  atStr.field_2._8_8_ = errorStr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,pcVar1,0x50,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Parser error: ",&local_f1)
  ;
  std::operator+(&local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 atStr.field_2._8_8_);
  std::operator+(&local_b0,&local_d0," near \'");
  std::operator+(&local_90,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_70,&local_90," ...\'");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  tcu::InternalError::InternalError
            (this_00,pcVar1,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibrary.cpp"
             ,0xce);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void ShaderParser::parseError(const std::string& errorStr)
{
	string atStr = string(m_curPtr, 80);
	throw tcu::InternalError((string("Parser error: ") + errorStr + " near '" + atStr + " ...'").c_str(), "", __FILE__,
							 __LINE__);
}